

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArray.H
# Opt level: O0

void __thiscall amrex::FabArray<amrex::CutFab>::FabArray(FabArray<amrex::CutFab> *this)

{
  FabArrayStats *in_RDI;
  FabArrayBase *unaff_retaddr;
  
  FabArrayBase::FabArrayBase(unaff_retaddr);
  *(undefined ***)in_RDI = &PTR__FabArray_01803e78;
  std::
  unique_ptr<amrex::FabFactory<amrex::CutFab>,std::default_delete<amrex::FabFactory<amrex::CutFab>>>
  ::unique_ptr<std::default_delete<amrex::FabFactory<amrex::CutFab>>,void>
            ((unique_ptr<amrex::FabFactory<amrex::CutFab>,_std::default_delete<amrex::FabFactory<amrex::CutFab>_>_>
              *)in_RDI);
  DataAllocator::DataAllocator((DataAllocator *)&in_RDI[10].max_num_boxarrays);
  *(undefined1 *)&in_RDI[10].num_build = 0;
  std::vector<amrex::CutFab_*,_std::allocator<amrex::CutFab_*>_>::vector
            ((vector<amrex::CutFab_*,_std::allocator<amrex::CutFab_*>_> *)0x117d622);
  *(__uniq_ptr_data<amrex::FBData<amrex::CutFab>,_std::default_delete<amrex::FBData<amrex::CutFab>_>,_true,_true>
    *)(in_RDI + 0xc) =
       (__uniq_ptr_data<amrex::FBData<amrex::CutFab>,_std::default_delete<amrex::FBData<amrex::CutFab>_>,_true,_true>
        )0x0;
  MultiArray4<double>::MultiArray4((MultiArray4<double> *)&in_RDI[0xc].max_num_boxarrays);
  MultiArray4<const_double>::MultiArray4((MultiArray4<const_double> *)&in_RDI[0xc].num_build);
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::Vector((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x117d660);
  ShMem::ShMem((ShMem *)(in_RDI + 0xe));
  std::unique_ptr<amrex::FBData<amrex::CutFab>,std::default_delete<amrex::FBData<amrex::CutFab>>>::
  unique_ptr<std::default_delete<amrex::FBData<amrex::CutFab>>,void>
            ((unique_ptr<amrex::FBData<amrex::CutFab>,_std::default_delete<amrex::FBData<amrex::CutFab>_>_>
              *)in_RDI);
  std::unique_ptr<amrex::PCData<amrex::CutFab>,std::default_delete<amrex::PCData<amrex::CutFab>>>::
  unique_ptr<std::default_delete<amrex::PCData<amrex::CutFab>>,void>
            ((unique_ptr<amrex::PCData<amrex::CutFab>,_std::default_delete<amrex::PCData<amrex::CutFab>_>_>
              *)in_RDI);
  std::
  unique_ptr<amrex::FabArray<amrex::CutFab>,std::default_delete<amrex::FabArray<amrex::CutFab>>>::
  unique_ptr<std::default_delete<amrex::FabArray<amrex::CutFab>>,void>
            ((unique_ptr<amrex::FabArray<amrex::CutFab>,_std::default_delete<amrex::FabArray<amrex::CutFab>_>_>
              *)in_RDI);
  FabArrayBase::FabArrayStats::recordBuild(in_RDI);
  return;
}

Assistant:

FabArray<FAB>::FabArray () noexcept
    : shmem()
{
    m_FA_stats.recordBuild();
}